

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitting_filter.c
# Opt level: O0

void WebRtcSpl_AllPassQMF
               (int32_t *in_data,size_t data_length,int32_t *out_data,uint16_t *filter_coefficients,
               int32_t *filter_state)

{
  uint uVar1;
  ulong uStack_38;
  int32_t diff;
  size_t k;
  int32_t *filter_state_local;
  uint16_t *filter_coefficients_local;
  int32_t *out_data_local;
  size_t data_length_local;
  int32_t *in_data_local;
  
  uVar1 = WebRtcSpl_SubSatW32(*in_data,filter_state[1]);
  *out_data = *filter_state + ((int)uVar1 >> 0x10) * (uint)*filter_coefficients +
              ((uVar1 & 0xffff) * (uint)*filter_coefficients >> 0x10);
  for (uStack_38 = 1; uStack_38 < data_length; uStack_38 = uStack_38 + 1) {
    uVar1 = WebRtcSpl_SubSatW32(in_data[uStack_38],out_data[uStack_38 - 1]);
    out_data[uStack_38] =
         in_data[uStack_38 - 1] + ((int)uVar1 >> 0x10) * (uint)*filter_coefficients +
         ((uVar1 & 0xffff) * (uint)*filter_coefficients >> 0x10);
  }
  *filter_state = in_data[data_length - 1];
  filter_state[1] = out_data[data_length - 1];
  uVar1 = WebRtcSpl_SubSatW32(*out_data,filter_state[3]);
  *in_data = filter_state[2] + ((int)uVar1 >> 0x10) * (uint)filter_coefficients[1] +
             ((uVar1 & 0xffff) * (uint)filter_coefficients[1] >> 0x10);
  for (uStack_38 = 1; uStack_38 < data_length; uStack_38 = uStack_38 + 1) {
    uVar1 = WebRtcSpl_SubSatW32(out_data[uStack_38],in_data[uStack_38 - 1]);
    in_data[uStack_38] =
         out_data[uStack_38 - 1] + ((int)uVar1 >> 0x10) * (uint)filter_coefficients[1] +
         ((uVar1 & 0xffff) * (uint)filter_coefficients[1] >> 0x10);
  }
  filter_state[2] = out_data[data_length - 1];
  filter_state[3] = in_data[data_length - 1];
  uVar1 = WebRtcSpl_SubSatW32(*in_data,filter_state[5]);
  *out_data = filter_state[4] + ((int)uVar1 >> 0x10) * (uint)filter_coefficients[2] +
              ((uVar1 & 0xffff) * (uint)filter_coefficients[2] >> 0x10);
  for (uStack_38 = 1; uStack_38 < data_length; uStack_38 = uStack_38 + 1) {
    uVar1 = WebRtcSpl_SubSatW32(in_data[uStack_38],out_data[uStack_38 - 1]);
    out_data[uStack_38] =
         in_data[uStack_38 - 1] + ((int)uVar1 >> 0x10) * (uint)filter_coefficients[2] +
         ((uVar1 & 0xffff) * (uint)filter_coefficients[2] >> 0x10);
  }
  filter_state[4] = in_data[data_length - 1];
  filter_state[5] = out_data[data_length - 1];
  return;
}

Assistant:

void WebRtcSpl_AllPassQMF(int32_t* in_data, size_t data_length,
                          int32_t* out_data, const uint16_t* filter_coefficients,
                          int32_t* filter_state)
{
    // The procedure is to filter the input with three first order all pass filters
    // (cascade operations).
    //
    //         a_3 + q^-1    a_2 + q^-1    a_1 + q^-1
    // y[n] =  -----------   -----------   -----------   x[n]
    //         1 + a_3q^-1   1 + a_2q^-1   1 + a_1q^-1
    //
    // The input vector |filter_coefficients| includes these three filter coefficients.
    // The filter state contains the in_data state, in_data[-1], followed by
    // the out_data state, out_data[-1]. This is repeated for each cascade.
    // The first cascade filter will filter the |in_data| and store the output in
    // |out_data|. The second will the take the |out_data| as input and make an
    // intermediate storage in |in_data|, to save memory. The third, and final, cascade
    // filter operation takes the |in_data| (which is the output from the previous cascade
    // filter) and store the output in |out_data|.
    // Note that the input vector values are changed during the process.
    size_t k;
    int32_t diff;
    // First all-pass cascade; filter from in_data to out_data.

    // Let y_i[n] indicate the output of cascade filter i (with filter coefficient a_i) at
    // vector position n. Then the final output will be y[n] = y_3[n]

    // First loop, use the states stored in memory.
    // "diff" should be safe from wrap around since max values are 2^25
    // diff = (x[0] - y_1[-1])
    diff = WebRtcSpl_SubSatW32(in_data[0], filter_state[1]);
    // y_1[0] =  x[-1] + a_1 * (x[0] - y_1[-1])
    out_data[0] = WEBRTC_SPL_SCALEDIFF32(filter_coefficients[0], diff, filter_state[0]);

    // For the remaining loops, use previous values.
    for (k = 1; k < data_length; k++)
    {
        // diff = (x[n] - y_1[n-1])
        diff = WebRtcSpl_SubSatW32(in_data[k], out_data[k - 1]);
        // y_1[n] =  x[n-1] + a_1 * (x[n] - y_1[n-1])
        out_data[k] = WEBRTC_SPL_SCALEDIFF32(filter_coefficients[0], diff, in_data[k - 1]);
    }

    // Update states.
    filter_state[0] = in_data[data_length - 1]; // x[N-1], becomes x[-1] next time
    filter_state[1] = out_data[data_length - 1]; // y_1[N-1], becomes y_1[-1] next time

    // Second all-pass cascade; filter from out_data to in_data.
    // diff = (y_1[0] - y_2[-1])
    diff = WebRtcSpl_SubSatW32(out_data[0], filter_state[3]);
    // y_2[0] =  y_1[-1] + a_2 * (y_1[0] - y_2[-1])
    in_data[0] = WEBRTC_SPL_SCALEDIFF32(filter_coefficients[1], diff, filter_state[2]);
    for (k = 1; k < data_length; k++)
    {
        // diff = (y_1[n] - y_2[n-1])
        diff = WebRtcSpl_SubSatW32(out_data[k], in_data[k - 1]);
        // y_2[0] =  y_1[-1] + a_2 * (y_1[0] - y_2[-1])
        in_data[k] = WEBRTC_SPL_SCALEDIFF32(filter_coefficients[1], diff, out_data[k-1]);
    }

    filter_state[2] = out_data[data_length - 1]; // y_1[N-1], becomes y_1[-1] next time
    filter_state[3] = in_data[data_length - 1]; // y_2[N-1], becomes y_2[-1] next time

    // Third all-pass cascade; filter from in_data to out_data.
    // diff = (y_2[0] - y[-1])
    diff = WebRtcSpl_SubSatW32(in_data[0], filter_state[5]);
    // y[0] =  y_2[-1] + a_3 * (y_2[0] - y[-1])
    out_data[0] = WEBRTC_SPL_SCALEDIFF32(filter_coefficients[2], diff, filter_state[4]);
    for (k = 1; k < data_length; k++)
    {
        // diff = (y_2[n] - y[n-1])
        diff = WebRtcSpl_SubSatW32(in_data[k], out_data[k - 1]);
        // y[n] =  y_2[n-1] + a_3 * (y_2[n] - y[n-1])
        out_data[k] = WEBRTC_SPL_SCALEDIFF32(filter_coefficients[2], diff, in_data[k-1]);
    }
    filter_state[4] = in_data[data_length - 1]; // y_2[N-1], becomes y_2[-1] next time
    filter_state[5] = out_data[data_length - 1]; // y[N-1], becomes y[-1] next time
}